

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.h
# Opt level: O1

shared_ptr<mocker::ir::Definition>
mocker::ir::detail::dyc_impl<mocker::ir::Definition,std::shared_ptr<mocker::ir::IRInst>const&>
          (shared_ptr<mocker::ir::IRInst> *v,Definition *param_2)

{
  element_type *peVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined1 auVar3 [16];
  shared_ptr<mocker::ir::Definition> sVar4;
  
  if (param_2->_vptr_Definition == (_func_int **)0x0) {
    peVar2 = (element_type *)0x0;
  }
  else {
    auVar3 = __dynamic_cast(param_2->_vptr_Definition,&IRInst::typeinfo,&Definition::typeinfo,
                            0xfffffffffffffffe);
    in_RDX._M_pi = auVar3._8_8_;
    peVar2 = auVar3._0_8_;
  }
  if (peVar2 == (element_type *)0x0) {
    (v->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (v->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (v->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2;
    peVar1 = (param_2->dest).super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (v->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1;
    if (peVar1 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(peVar1->identifier)._M_dataplus._M_p =
             *(int *)&(peVar1->identifier)._M_dataplus._M_p + 1;
        UNLOCK();
      }
      else {
        *(int *)&(peVar1->identifier)._M_dataplus._M_p =
             *(int *)&(peVar1->identifier)._M_dataplus._M_p + 1;
      }
    }
  }
  sVar4.super___shared_ptr<mocker::ir::Definition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar4.super___shared_ptr<mocker::ir::Definition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)v;
  return (shared_ptr<mocker::ir::Definition>)
         sVar4.super___shared_ptr<mocker::ir::Definition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> dyc_impl(V &&v, T *) {
  return std::dynamic_pointer_cast<T>(v);
}